

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxInWitnessCountByHandle
              (void *handle,void *tx_data_handle,int stack_type,uint32_t txin_index,uint32_t *count)

{
  uint32_t uVar1;
  undefined8 uVar2;
  uint32_t in_ECX;
  int in_EDX;
  long in_RSI;
  uint32_t *in_R8;
  CfdException *except;
  exception *std_except;
  ConfidentialTxInReference ref_1;
  ConfidentialTransactionContext *tx_1;
  TxInReference ref;
  TransactionContext *tx;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  ConfidentialTxInReference *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc90;
  string *message;
  CfdError in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  bool *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce4;
  undefined1 local_311 [33];
  CfdSourceLocation local_2f0 [5];
  string *in_stack_fffffffffffffd88;
  void *in_stack_fffffffffffffd90;
  allocator local_169;
  string local_168 [32];
  CfdSourceLocation local_148;
  TxInReference local_130;
  Transaction *local_a0;
  undefined1 local_92;
  allocator local_91;
  string local_90 [39];
  byte local_69;
  long local_68;
  allocator local_59;
  string local_58 [48];
  uint32_t *local_28;
  uint32_t local_20;
  int local_1c;
  long local_18;
  
  local_28 = in_R8;
  local_20 = in_ECX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"TransactionData",&local_59);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  local_68 = local_18;
  local_69 = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffffce4,in_stack_fffffffffffffcd8);
  if (*(long *)(local_68 + 0x18) == 0) {
    local_92 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,"Invalid handle state. tx is null",&local_91);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
               in_stack_fffffffffffffc9c,in_stack_fffffffffffffc90);
    local_92 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_69 & 1) == 0) {
    cfd::core::ConfidentialTransaction::GetTxIn
              ((ConfidentialTxInReference *)(local_2f0 + 1),
               *(ConfidentialTransaction **)(local_68 + 0x18),local_20);
    if (local_1c == 0) {
      if (local_28 != (uint32_t *)0x0) {
        uVar1 = cfd::core::AbstractTxInReference::GetScriptWitnessStackNum
                          ((AbstractTxInReference *)0x62c541);
        *local_28 = uVar1;
      }
    }
    else {
      if (local_1c != 1) {
        local_2f0[0].filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                     ,0x2f);
        local_2f0[0].filename = local_2f0[0].filename + 1;
        local_2f0[0].line = 0xf60;
        local_2f0[0].funcname = "CfdGetTxInWitnessCountByHandle";
        cfd::core::logger::warn<int&>(local_2f0,"Invalid stack type[{}]",&local_1c);
        uVar2 = __cxa_allocate_exception(0x30);
        message = (string *)local_311;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)(local_311 + 1),"Invalid stack type.",(allocator *)message);
        cfd::core::CfdException::CfdException
                  ((CfdException *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   in_stack_fffffffffffffc9c,message);
        __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
        ;
      }
      if (local_28 != (uint32_t *)0x0) {
        uVar1 = cfd::core::ConfidentialTxInReference::GetPeginWitnessStackNum
                          ((ConfidentialTxInReference *)0x62c597);
        *local_28 = uVar1;
      }
    }
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(in_stack_fffffffffffffc80);
  }
  else {
    local_a0 = *(Transaction **)(local_68 + 0x18);
    cfd::core::Transaction::GetTxIn(&local_130,local_a0,local_20);
    if (local_1c != 0) {
      local_148.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                   ,0x2f);
      local_148.filename = local_148.filename + 1;
      local_148.line = 0xf51;
      local_148.funcname = "CfdGetTxInWitnessCountByHandle";
      cfd::core::logger::warn<int&>(&local_148,"Invalid stack type[{}]",&local_1c);
      uVar2 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_168,"Invalid stack type.",&local_169);
      cfd::core::CfdException::CfdException
                ((CfdException *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                 in_stack_fffffffffffffc9c,in_stack_fffffffffffffc90);
      __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    if (local_28 != (uint32_t *)0x0) {
      uVar1 = cfd::core::AbstractTxInReference::GetScriptWitnessStackNum
                        ((AbstractTxInReference *)0x62c4b5);
      *local_28 = uVar1;
    }
    cfd::core::TxInReference::~TxInReference((TxInReference *)0x62c4d6);
  }
  return 0;
}

Assistant:

int CfdGetTxInWitnessCountByHandle(
    void* handle, void* tx_data_handle, int stack_type, uint32_t txin_index,
    uint32_t* count) {
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type != kCfdTxWitnessStackNormal) {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
      if (count != nullptr) *count = ref.GetScriptWitnessStackNum();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxInReference ref = tx->GetTxIn(txin_index);
      if (stack_type == kCfdTxWitnessStackNormal) {
        if (count != nullptr) *count = ref.GetScriptWitnessStackNum();
      } else if (stack_type == kCfdTxWitnessStackPegin) {
        if (count != nullptr) *count = ref.GetPeginWitnessStackNum();
      } else {
        warn(CFD_LOG_SOURCE, "Invalid stack type[{}]", stack_type);
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Invalid stack type.");
      }
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}